

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanocat.c
# Opt level: O0

void nn_sub_init(nn_options_t *options,int sock)

{
  char *pcVar1;
  int iVar2;
  size_t sVar3;
  int local_18;
  int rc;
  int i;
  int sock_local;
  nn_options_t *options_local;
  
  if ((options->subscriptions).num == 0) {
    iVar2 = nn_setsockopt(sock,0x21,1,"",0);
    nn_assert_errno((uint)(iVar2 == 0),"Can\'t subscribe");
  }
  else {
    for (local_18 = 0; local_18 < (options->subscriptions).num; local_18 = local_18 + 1) {
      pcVar1 = (options->subscriptions).items[local_18];
      sVar3 = strlen((options->subscriptions).items[local_18]);
      iVar2 = nn_setsockopt(sock,0x21,1,pcVar1,sVar3);
      nn_assert_errno((uint)(iVar2 == 0),"Can\'t subscribe");
    }
  }
  return;
}

Assistant:

void nn_sub_init (nn_options_t *options, int sock)
{
    int i;
    int rc;

    if (options->subscriptions.num) {
        for (i = 0; i < options->subscriptions.num; ++i) {
            rc = nn_setsockopt (sock, NN_SUB, NN_SUB_SUBSCRIBE,
                options->subscriptions.items[i],
                strlen (options->subscriptions.items[i]));
            nn_assert_errno (rc == 0, "Can't subscribe");
        }
    } else {
        rc = nn_setsockopt (sock, NN_SUB, NN_SUB_SUBSCRIBE, "", 0);
        nn_assert_errno (rc == 0, "Can't subscribe");
    }
}